

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

bool __thiscall
nlohmann::detail::
binary_reader<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
::get_ubjson_high_precision_number
          (binary_reader<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *this)

{
  byte *pbVar1;
  json_sax_dom_parser<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this_00;
  size_t sVar2;
  bool bVar3;
  char cVar4;
  token_type tVar5;
  token_type tVar6;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_R9;
  ulong uVar10;
  size_t size;
  vector<char,_std::allocator<char>_> number_vector;
  string number_string;
  lexer<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  number_lexer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8;
  undefined1 local_188 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  string local_158;
  undefined **local_138 [2];
  runtime_error local_128 [24];
  size_t local_110;
  vector<char,_std::allocator<char>_> local_108;
  string local_e8;
  lexer<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  local_c8;
  
  local_110 = 0;
  bVar3 = get_ubjson_size_value(this,&local_110);
  if (!bVar3) {
    return false;
  }
  local_108.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
  ._0_4_ = 0;
  local_108.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
  ._4_4_ = 0;
  local_108.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ = 0;
  local_108.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._4_4_ = 0;
  local_108.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_108.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_108.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (local_110 != 0) {
    uVar10 = 0;
    do {
      this->chars_read = this->chars_read + 1;
      pbVar1 = (this->ia).current._M_current;
      if (pbVar1 == (this->ia).end._M_current) {
        uVar7 = 0xffffffffffffffff;
      }
      else {
        uVar7 = (ulong)*pbVar1;
        (this->ia).current._M_current = pbVar1 + 1;
      }
      this->current = uVar7;
      bVar3 = unexpect_eof(this,ubjson,"number");
      if (!bVar3) {
        bVar3 = false;
        goto LAB_001959e1;
      }
      local_c8.ia.current._M_current._0_4_ =
           CONCAT31(local_c8.ia.current._M_current._1_3_,(char)this->current);
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(&local_108,(char *)&local_c8);
      uVar10 = uVar10 + 1;
    } while (uVar10 < local_110);
  }
  local_c8.token_buffer._M_dataplus._M_p = (pointer)&local_c8.token_buffer.field_2;
  local_c8.ignore_comments = false;
  local_c8.current = -1;
  local_c8.next_unget = false;
  local_c8.position.chars_read_total = 0;
  local_c8.position.chars_read_current_line = 0;
  local_c8.position.lines_read = 0;
  local_c8.token_string.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.token_string.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.token_string.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.token_buffer._M_string_length = 0;
  local_c8.token_buffer.field_2._M_local_buf[0] = '\0';
  local_c8.error_message = "";
  local_c8.value_integer = 0;
  local_c8.value_unsigned = 0;
  local_c8.value_float = 0.0;
  local_c8.ia.current._M_current._0_4_ =
       local_108.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start._0_4_;
  local_c8.ia.current._M_current._4_4_ =
       local_108.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start._4_4_;
  local_c8.ia.end._M_current._0_4_ =
       local_108.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  local_c8.ia.end._M_current._4_4_ =
       local_108.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  cVar4 = lexer<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
          ::get_decimal_point();
  local_c8.decimal_point_char = (char_int_type)cVar4;
  tVar5 = lexer<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
          ::scan(&local_c8);
  lexer<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::get_token_string(&local_e8,&local_c8);
  tVar6 = lexer<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
          ::scan(&local_c8);
  this_00 = this->sax;
  if (tVar6 == end_of_input) {
    if (tVar5 == value_unsigned) {
      local_138[0] = (undefined **)local_c8.value_unsigned;
      json_sax_dom_parser<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::handle_value<unsigned_long&>
                ((json_sax_dom_parser<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  *)this_00,(unsigned_long *)local_138);
    }
    else if (tVar5 == value_float) {
      local_138[0] = (undefined **)local_c8.value_float;
      json_sax_dom_parser<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::handle_value<double&>
                ((json_sax_dom_parser<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  *)this_00,(double *)local_138);
    }
    else {
      if (tVar5 != value_integer) {
        sVar2 = this->chars_read;
        lexer<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
        ::get_token_string((string *)(local_188 + 0x10),&local_c8);
        pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_188 + 0x10),0,0,"invalid number text: ",0x15);
        local_1c8._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
        paVar9 = &pbVar8->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p == paVar9) {
          local_1c8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_1c8.field_2._8_4_ = *(undefined4 *)((long)&pbVar8->field_2 + 8);
          local_1c8.field_2._12_4_ = *(undefined4 *)((long)&pbVar8->field_2 + 0xc);
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        }
        else {
          local_1c8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        }
        local_1c8._M_string_length = pbVar8->_M_string_length;
        (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
        pbVar8->_M_string_length = 0;
        (pbVar8->field_2)._M_local_buf[0] = '\0';
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1a8,"high-precision number","");
        exception_message(&local_158,this,ubjson,&local_1c8,&local_1a8);
        local_188[0] = null;
        local_188._8_8_ = (object_t *)0x0;
        basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_188,true);
        basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_188,true);
        parse_error::
        create<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((parse_error *)local_138,(parse_error *)0x73,(int)sVar2,(size_t)&local_158,
                   (string *)local_188,in_R9);
        bVar3 = json_sax_dom_parser<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::parse_error<nlohmann::detail::parse_error>
                          (this_00,sVar2,&local_e8,(parse_error *)local_138);
        local_138[0] = &PTR__exception_00262418;
        std::runtime_error::~runtime_error
                  ((runtime_error *)((long)&((parse_error *)local_138)->super_exception + 0x10));
        std::exception::~exception((exception *)local_138);
        basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)local_188);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) goto LAB_00195b99;
        goto LAB_00195ba6;
      }
      local_138[0] = (undefined **)local_c8.value_integer;
      json_sax_dom_parser<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::handle_value<long&>
                ((json_sax_dom_parser<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  *)this_00,(long *)local_138);
    }
    bVar3 = true;
  }
  else {
    sVar2 = this->chars_read;
    lexer<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
    ::get_token_string((string *)(local_188 + 0x10),&local_c8);
    std::operator+(&local_1c8,"invalid number text: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_188 + 0x10));
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"high-precision number","")
    ;
    exception_message(&local_158,this,ubjson,&local_1c8,&local_1a8);
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)local_188,(nullptr_t)0x0);
    parse_error::
    create<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((parse_error *)local_138,(parse_error *)0x73,(int)sVar2,(size_t)&local_158,
               (string *)local_188,in_R9);
    bVar3 = json_sax_dom_parser<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::parse_error<nlohmann::detail::parse_error>
                      (this_00,sVar2,&local_e8,(parse_error *)local_138);
    local_138[0] = &PTR__exception_00262418;
    std::runtime_error::~runtime_error
              ((runtime_error *)((long)&((parse_error *)local_138)->super_exception + 0x10));
    std::exception::~exception((exception *)local_138);
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
LAB_00195b99:
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
LAB_00195ba6:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._16_8_ != &local_168) {
      operator_delete((void *)local_188._16_8_,local_168._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  lexer<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::~lexer(&local_c8);
LAB_001959e1:
  if (local_108.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool get_ubjson_high_precision_number()
    {
        // get size of following number string
        std::size_t size{};
        auto res = get_ubjson_size_value(size);
        if (JSON_HEDLEY_UNLIKELY(!res))
        {
            return res;
        }

        // get number string
        std::vector<char> number_vector;
        for (std::size_t i = 0; i < size; ++i)
        {
            get();
            if (JSON_HEDLEY_UNLIKELY(!unexpect_eof(input_format_t::ubjson, "number")))
            {
                return false;
            }
            number_vector.push_back(static_cast<char>(current));
        }

        // parse number string
        using ia_type = decltype(detail::input_adapter(number_vector));
        auto number_lexer = detail::lexer<BasicJsonType, ia_type>(detail::input_adapter(number_vector), false);
        const auto result_number = number_lexer.scan();
        const auto number_string = number_lexer.get_token_string();
        const auto result_remainder = number_lexer.scan();

        using token_type = typename detail::lexer_base<BasicJsonType>::token_type;

        if (JSON_HEDLEY_UNLIKELY(result_remainder != token_type::end_of_input))
        {
            return sax->parse_error(chars_read, number_string, parse_error::create(115, chars_read, exception_message(input_format_t::ubjson, "invalid number text: " + number_lexer.get_token_string(), "high-precision number"), BasicJsonType()));
        }

        switch (result_number)
        {
            case token_type::value_integer:
                return sax->number_integer(number_lexer.get_number_integer());
            case token_type::value_unsigned:
                return sax->number_unsigned(number_lexer.get_number_unsigned());
            case token_type::value_float:
                return sax->number_float(number_lexer.get_number_float(), std::move(number_string));
            case token_type::uninitialized:
            case token_type::literal_true:
            case token_type::literal_false:
            case token_type::literal_null:
            case token_type::value_string:
            case token_type::begin_array:
            case token_type::begin_object:
            case token_type::end_array:
            case token_type::end_object:
            case token_type::name_separator:
            case token_type::value_separator:
            case token_type::parse_error:
            case token_type::end_of_input:
            case token_type::literal_or_value:
            default:
                return sax->parse_error(chars_read, number_string, parse_error::create(115, chars_read, exception_message(input_format_t::ubjson, "invalid number text: " + number_lexer.get_token_string(), "high-precision number"), BasicJsonType()));
        }
    }